

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_mgga_xc_kcis.c
# Opt level: O3

void hyb_mgga_xc_kcis_init(xc_func_type *p)

{
  uint uVar1;
  double *in_RSI;
  double dVar2;
  int funcs_id [2];
  double funcs_coef [2];
  int local_20 [2];
  double local_18 [2];
  
  uVar1 = p->info->number - 0x236;
  if (uVar1 < 4) {
    local_20[0] = *(int *)(&DAT_00fc2818 + (ulong)uVar1 * 4);
    dVar2 = *(double *)(&DAT_00fc2828 + (ulong)uVar1 * 8);
    local_18[0] = 1.0 - dVar2;
    local_20[1] = 0x232;
    local_18[1] = 1.0;
    xc_mix_init(p,2,local_20,local_18);
    xc_hyb_init_hybrid(p,dVar2);
    return;
  }
  hyb_mgga_xc_kcis_init_cold_1();
  dVar2 = get_ext_param(p,in_RSI,0);
  *p->mix_coef = 1.0 - dVar2;
  p->cam_alpha = dVar2;
  return;
}

Assistant:

static void
hyb_mgga_xc_kcis_init(xc_func_type *p)
{
  /* Exchange functional */
  int xid;
  /* Fraction of exact exchange */
  double exx;
  /* Array */
  int funcs_id[2];
  double funcs_coef[2];

  switch(p->info->number){
  case XC_HYB_MGGA_XC_MPW1KCIS:
    xid=XC_GGA_X_MPW91;
    exx=0.15;
    break;
  case XC_HYB_MGGA_XC_MPWKCIS1K:
    xid=XC_GGA_X_MPW91;
    exx=0.41;
    break;
  case XC_HYB_MGGA_XC_PBE1KCIS:
    xid=XC_GGA_X_PBE;
    exx=0.22;
    break;
  case XC_HYB_MGGA_XC_TPSS1KCIS:
    xid=XC_MGGA_X_TPSS;
    exx=0.13;
    break;
  default:
    fprintf(stderr, "Internal error in hyb_mgga_xc_kcis\n");
    exit(1);
  }

  /* Initialize mix */
  funcs_id[0] = xid;
  funcs_coef[0] = 1.0 - exx;

  funcs_id[1] = XC_MGGA_C_KCIS;
  funcs_coef[1] = 1.0;

  xc_mix_init(p, 2, funcs_id, funcs_coef);
  xc_hyb_init_hybrid(p, exx);
}